

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O2

void ** __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::InternalExtend
          (RepeatedPtrFieldBase *this,int extend_amount)

{
  ulong n;
  Rep *pRVar1;
  Arena *this_00;
  uint uVar2;
  Rep *pRVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  iVar4 = this->current_size_;
  uVar5 = extend_amount + iVar4;
  pRVar1 = this->rep_;
  pRVar3 = pRVar1;
  if (this->total_size_ < (int)uVar5) {
    this_00 = this->arena_;
    uVar2 = this->total_size_ * 2;
    if ((int)uVar2 <= (int)uVar5) {
      uVar2 = uVar5;
    }
    uVar6 = 4;
    if (4 < (int)uVar2) {
      uVar6 = (ulong)uVar2;
    }
    n = uVar6 * 8 + 8;
    if (this_00 == (Arena *)0x0) {
      pRVar3 = (Rep *)operator_new(n);
    }
    else {
      pRVar3 = (Rep *)Arena::AllocateAligned(this_00,(type_info *)&char::typeinfo,n);
    }
    this->rep_ = pRVar3;
    iVar4 = this->total_size_;
    this->total_size_ = (int)uVar6;
    if ((pRVar1 == (Rep *)0x0) || ((long)pRVar1->allocated_size < 1)) {
      pRVar3->allocated_size = 0;
    }
    else {
      memcpy(pRVar3->elements,pRVar1->elements,(long)pRVar1->allocated_size << 3);
      pRVar3 = this->rep_;
      pRVar3->allocated_size = pRVar1->allocated_size;
    }
    if (this_00 == (Arena *)0x0) {
      operator_delete(pRVar1,(long)iVar4 * 8 + 8);
      pRVar3 = this->rep_;
    }
    iVar4 = this->current_size_;
  }
  return pRVar3->elements + iVar4;
}

Assistant:

void** RepeatedPtrFieldBase::InternalExtend(int extend_amount) {
  int new_size = current_size_ + extend_amount;
  if (total_size_ >= new_size) {
    // N.B.: rep_ is non-NULL because extend_amount is always > 0, hence
    // total_size must be non-zero since it is lower-bounded by new_size.
    return &rep_->elements[current_size_];
  }
  Rep* old_rep = rep_;
  Arena* arena = GetArenaNoVirtual();
  new_size = std::max(kMinRepeatedFieldAllocationSize,
                      std::max(total_size_ * 2, new_size));
  GOOGLE_CHECK_LE(new_size,
           (std::numeric_limits<size_t>::max() - kRepHeaderSize) /
           sizeof(old_rep->elements[0]))
      << "Requested size is too large to fit into size_t.";
  size_t bytes = kRepHeaderSize + sizeof(old_rep->elements[0]) * new_size;
  if (arena == NULL) {
    rep_ = reinterpret_cast<Rep*>(::operator new(bytes));
  } else {
    rep_ = reinterpret_cast<Rep*>(
        ::google::protobuf::Arena::CreateArray<char>(arena, bytes));
  }
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
  const int old_total_size = total_size_;
#endif
  total_size_ = new_size;
  if (old_rep && old_rep->allocated_size > 0) {
    memcpy(rep_->elements, old_rep->elements,
           old_rep->allocated_size * sizeof(rep_->elements[0]));
    rep_->allocated_size = old_rep->allocated_size;
  } else {
    rep_->allocated_size = 0;
  }
  if (arena == NULL) {
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
    const size_t old_size =
        old_total_size * sizeof(rep_->elements[0]) + kRepHeaderSize;
    ::operator delete(static_cast<void*>(old_rep), old_size);
#else
    ::operator delete(static_cast<void*>(old_rep));
#endif
  }
  return &rep_->elements[current_size_];
}